

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paths.cc
# Opt level: O1

PathBuilder * __thiscall PathBuilder::Add(PathBuilder *this,string *component)

{
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (component->_M_string_length != 0) {
    if (*(component->_M_dataplus)._M_p == '/') {
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"");
      std::__cxx11::stringbuf::str((string *)&this->field_0x10);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0]);
      }
    }
    else if (this->trailing_slash_ == false) {
      local_40[0] = (undefined1 *)CONCAT71(local_40[0]._1_7_,0x2f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->path_,(char *)local_40,1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->path_,(component->_M_dataplus)._M_p,component->_M_string_length);
    this->trailing_slash_ = (component->_M_dataplus)._M_p[component->_M_string_length - 1] == '/';
  }
  return this;
}

Assistant:

PathBuilder& Add(const std::string& component) {
    if (!component.empty()) {
      if (component.front() == '/') {
        path_.str("");
        path_ << component;
      } else {
        if (!trailing_slash_) {
          path_ << '/';
        }
        path_ << component;
      }
      trailing_slash_ = component.back() == '/';
    }
    return *this;
  }